

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void StartPosQueuePush(StartPosQueue *self,PosData *posdata)

{
  float *pfVar1;
  float fVar2;
  ulong uVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  PosData *pPVar9;
  PosData *pPVar10;
  PosData *pPVar11;
  PosData __brotli_swap_tmp;
  PosData *q;
  size_t i;
  size_t len;
  size_t offset;
  PosData *posdata_local;
  StartPosQueue *self_local;
  
  uVar3 = self->idx_;
  self->idx_ = uVar3 + 1;
  len = (uVar3 ^ 0xffffffffffffffff) & 7;
  pPVar9 = (PosData *)StartPosQueueSize(self);
  pPVar10 = self->q_ + len;
  pPVar10->pos = posdata->pos;
  *(undefined8 *)pPVar10->distance_cache = *(undefined8 *)posdata->distance_cache;
  *(undefined8 *)(pPVar10->distance_cache + 2) = *(undefined8 *)(posdata->distance_cache + 2);
  fVar2 = posdata->cost;
  pPVar10->costdiff = posdata->costdiff;
  pPVar10->cost = fVar2;
  for (q = (PosData *)0x1; q < pPVar9; q = (PosData *)((long)&q->pos + 1)) {
    fVar2 = self->q_[len & 7].costdiff;
    pfVar1 = &self->q_[len + 1 & 7].costdiff;
    if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
      pPVar10 = self->q_ + (len & 7);
      sVar4 = pPVar10->pos;
      uVar5 = *(undefined8 *)pPVar10->distance_cache;
      uVar6 = *(undefined8 *)(pPVar10->distance_cache + 2);
      fVar7 = pPVar10->costdiff;
      fVar8 = pPVar10->cost;
      pPVar10 = self->q_ + (len & 7);
      pPVar11 = self->q_ + (len + 1 & 7);
      pPVar10->pos = pPVar11->pos;
      *(undefined8 *)pPVar10->distance_cache = *(undefined8 *)pPVar11->distance_cache;
      *(undefined8 *)(pPVar10->distance_cache + 2) = *(undefined8 *)(pPVar11->distance_cache + 2);
      fVar2 = pPVar11->cost;
      pPVar10->costdiff = pPVar11->costdiff;
      pPVar10->cost = fVar2;
      pPVar10 = self->q_ + (len + 1 & 7);
      pPVar10->pos = sVar4;
      *(undefined8 *)pPVar10->distance_cache = uVar5;
      *(undefined8 *)(pPVar10->distance_cache + 2) = uVar6;
      pPVar10->costdiff = fVar7;
      pPVar10->cost = fVar8;
    }
    len = len + 1;
  }
  return;
}

Assistant:

static void StartPosQueuePush(StartPosQueue* self, const PosData* posdata) {
  size_t offset = ~(self->idx_++) & 7;
  size_t len = StartPosQueueSize(self);
  size_t i;
  PosData* q = self->q_;
  q[offset] = *posdata;
  /* Restore the sorted order. In the list of |len| items at most |len - 1|
     adjacent element comparisons / swaps are required. */
  for (i = 1; i < len; ++i) {
    if (q[offset & 7].costdiff > q[(offset + 1) & 7].costdiff) {
      BROTLI_SWAP(PosData, q, offset & 7, (offset + 1) & 7);
    }
    ++offset;
  }
}